

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O0

void __thiscall Downloader::saveFile(Downloader *this,qint64 received,qint64 total)

{
  byte bVar1;
  QByteArray local_b8;
  Int local_9c;
  QString local_98;
  QString local_80;
  undefined1 local_68 [8];
  QFile file;
  QVariant local_48 [32];
  QUrl local_28;
  QUrl url;
  qint64 total_local;
  qint64 received_local;
  Downloader *this_local;
  
  url.d = (QUrlPrivate *)total;
  QNetworkReply::attribute((Attribute)local_48);
  QVariant::toUrl();
  QVariant::~QVariant(local_48);
  bVar1 = QUrl::isEmpty();
  if ((bVar1 & 1) == 0) {
    startDownload(this,&local_28);
  }
  else {
    operator+(&local_98,&this->m_fileName,&PARTIAL_DOWN);
    QDir::filePath((QString *)&local_80);
    QFile::QFile((QFile *)local_68,(QString *)&local_80);
    QString::~QString(&local_80);
    QString::~QString(&local_98);
    local_9c = (Int)operator|(WriteOnly,Append);
    bVar1 = QFile::open((QFlags_conflict1 *)local_68);
    if ((bVar1 & 1) != 0) {
      QIODevice::readAll();
      QIODevice::write((QByteArray *)local_68);
      QByteArray::~QByteArray(&local_b8);
      QFileDevice::close();
    }
    QFile::~QFile((QFile *)local_68);
  }
  QUrl::~QUrl(&local_28);
  return;
}

Assistant:

void Downloader::saveFile(qint64 received, qint64 total)
{
   Q_UNUSED(received);
   Q_UNUSED(total);

   /* Check if we need to redirect */
   QUrl url = m_reply->attribute(QNetworkRequest::RedirectionTargetAttribute).toUrl();
   if (!url.isEmpty())
   {
      startDownload(url);
      return;
   }

   /* Save downloaded data to disk */
   QFile file(m_downloadDir.filePath(m_fileName + PARTIAL_DOWN));
   if (file.open(QIODevice::WriteOnly | QIODevice::Append))
   {
      file.write(m_reply->readAll());
      file.close();
   }
}